

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

void __thiscall DynamicGraph::showVirtualEdges(DynamicGraph *this)

{
  bool bVar1;
  reference peVar2;
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_50;
  unsigned_long local_30;
  Vertex t;
  Vertex s;
  _Self local_18;
  iterator ei;
  DynamicGraph *this_local;
  
  ei._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin(&this->virtualEdges);
  while( true ) {
    s = (Vertex)std::
                set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                ::end(&this->virtualEdges);
    bVar1 = std::operator!=(&local_18,(_Self *)&s);
    if (!bVar1) break;
    peVar2 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_18);
    t = boost::
        source<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                  (&peVar2->super_edge_base<boost::undirected_tag,_unsigned_long>,
                   &this->super_UndirectedGraph);
    peVar2 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_18);
    local_30 = boost::
               target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                         (&peVar2->super_edge_base<boost::undirected_tag,_unsigned_long>,
                          &this->super_UndirectedGraph);
    boost::
    add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
              (&local_50,(boost *)t,local_30,(vertex_descriptor)this,in_R8);
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&local_18);
  }
  return;
}

Assistant:

void DynamicGraph::showVirtualEdges()
{
    for(auto ei = this->virtualEdges.begin(); ei != virtualEdges.end(); ++ei) {
        Vertex s = source(*ei, *this);
        Vertex t = target(*ei, *this);
        boost::add_edge(s, t, *this);
    }
}